

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

void __thiscall wasm::HeapType::HeapType(HeapType *this,Continuation continuation)

{
  HeapType HVar1;
  undefined8 local_20;
  
  HVar1 = continuation.type.id;
  local_20 = operator_new(0x50);
  *(undefined2 *)local_20 = 0;
  *(undefined4 *)(local_20 + 4) = 1;
  *(undefined8 *)(local_20 + 8) = 0;
  *(undefined8 *)(local_20 + 0x10) = 0;
  *(undefined8 *)(local_20 + 0x18) = 0;
  *(undefined8 *)(local_20 + 0x20) = 0;
  *(undefined8 *)(local_20 + 0x28) = 0;
  *(undefined4 *)(local_20 + 0x30) = 4;
  ((HeapType *)(local_20 + 0x38))->id = (uintptr_t)continuation.type.id;
  HVar1 = anon_unknown_0::RecGroupStore::insert((RecGroupStore *)&stack0xffffffffffffffe0,HVar1.id);
  this->id = (uintptr_t)HVar1;
  std::
  unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
  ::~unique_ptr((unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                 *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

HeapType::HeapType(Continuation continuation) {
  new (this) HeapType(
    globalRecGroupStore.insert(std::make_unique<HeapTypeInfo>(continuation)));
}